

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O0

void __thiscall ftxui::VBox::ComputeRequirement(VBox *this)

{
  Selection SVar1;
  bool bVar2;
  Elements *this_00;
  element_type *peVar3;
  int *piVar4;
  Requirement local_10c;
  Requirement local_e0;
  Requirement local_b4;
  Requirement local_88;
  Requirement local_5c;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_30;
  shared_ptr<ftxui::Node> *child;
  iterator __end2;
  iterator __begin2;
  Elements *__range2;
  VBox *this_local;
  
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  (this->super_Node).requirement_.flex_grow_x = 0;
  (this->super_Node).requirement_.flex_grow_y = 0;
  (this->super_Node).requirement_.flex_shrink_x = 0;
  (this->super_Node).requirement_.flex_shrink_y = 0;
  this_00 = &(this->super_Node).children_;
  __end2 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::begin(this_00);
  child = (shared_ptr<ftxui::Node> *)
          std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
                                *)&child);
    if (!bVar2) break;
    local_30 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
               ::operator*(&__end2);
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_30);
    (*peVar3->_vptr_Node[2])();
    SVar1 = (this->super_Node).requirement_.selection;
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_30);
    Node::requirement(&local_5c,peVar3);
    if ((int)SVar1 < (int)local_5c.selection) {
      peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_30);
      Node::requirement(&local_88,peVar3);
      (this->super_Node).requirement_.selection = local_88.selection;
      peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_30);
      Node::requirement(&local_b4,peVar3);
      (this->super_Node).requirement_.selected_box.x_min = local_b4.selected_box.x_min;
      (this->super_Node).requirement_.selected_box.x_max = local_b4.selected_box.x_max;
      (this->super_Node).requirement_.selected_box.y_min = local_b4.selected_box.y_min;
      (this->super_Node).requirement_.selected_box.y_max = local_b4.selected_box.y_max;
      (this->super_Node).requirement_.selected_box.y_min =
           (this->super_Node).requirement_.min_y +
           (this->super_Node).requirement_.selected_box.y_min;
      (this->super_Node).requirement_.selected_box.y_max =
           (this->super_Node).requirement_.min_y +
           (this->super_Node).requirement_.selected_box.y_max;
    }
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_30);
    Node::requirement(&local_e0,peVar3);
    (this->super_Node).requirement_.min_y = local_e0.min_y + (this->super_Node).requirement_.min_y;
    peVar3 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_30);
    Node::requirement(&local_10c,peVar3);
    piVar4 = std::max<int>(&(this->super_Node).requirement_.min_x,&local_10c.min_x);
    (this->super_Node).requirement_.min_x = *piVar4;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    requirement_.flex_grow_x = 0;
    requirement_.flex_grow_y = 0;
    requirement_.flex_shrink_x = 0;
    requirement_.flex_shrink_y = 0;
    for (auto& child : children_) {
      child->ComputeRequirement();
      if (requirement_.selection < child->requirement().selection) {
        requirement_.selection = child->requirement().selection;
        requirement_.selected_box = child->requirement().selected_box;
        requirement_.selected_box.y_min += requirement_.min_y;
        requirement_.selected_box.y_max += requirement_.min_y;
      }
      requirement_.min_y += child->requirement().min_y;
      requirement_.min_x =
          std::max(requirement_.min_x, child->requirement().min_x);
    }
  }